

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset_util.c
# Opt level: O2

uint64_t bitset_clear_list(uint64_t *words,uint64_t card,uint16_t *list,uint64_t length)

{
  ushort *puVar1;
  ushort uVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  
  uVar5 = croaring_hardware_support();
  if ((uVar5 & 1) == 0) {
    for (lVar6 = 0; length * 2 != lVar6; lVar6 = lVar6 + 2) {
      uVar2 = *(ushort *)((long)list + lVar6);
      card = card - ((words[uVar2 >> 6] >> ((ulong)uVar2 & 0x3f) & 1) != 0);
      words[uVar2 >> 6] = words[uVar2 >> 6] & ~(1L << ((ulong)uVar2 & 0x3f));
    }
  }
  else if (length != 0) {
    puVar1 = list + length;
    do {
      uVar2 = *list >> 6;
      uVar3 = words[uVar2];
      uVar4 = (ulong)*list & 0x3f;
      words[uVar2] = uVar3 & ~(1L << uVar4);
      card = card - ((uVar3 >> uVar4 & 1) != 0);
      list = list + 1;
    } while (puVar1 != list);
  }
  return card;
}

Assistant:

uint64_t bitset_clear_list(uint64_t *words, uint64_t card, const uint16_t *list,
                           uint64_t length) {
    if (croaring_hardware_support() & ROARING_SUPPORTS_AVX2) {
        return _asm_bitset_clear_list(words, card, list, length);
    } else {
        return _scalar_bitset_clear_list(words, card, list, length);
    }
}